

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Parser
cm_expat_XML_ExternalEntityParserCreate
          (XML_Parser oldParser,XML_Char *context,XML_Char *encodingName)

{
  undefined4 uVar1;
  size_t sVar2;
  XML_Memory_Handling_Suite *pXVar3;
  NAMED **ppNVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  XML_Memory_Handling_Suite *pXVar8;
  BLOCK *pBVar9;
  XML_Char *pXVar10;
  XML_Char *pXVar11;
  XML_Memory_Handling_Suite *pXVar12;
  undefined8 uVar13;
  NAMED **ppNVar14;
  size_t sVar15;
  size_t sVar16;
  XML_Memory_Handling_Suite *pXVar17;
  XML_Char *pXVar18;
  BINDING *pBVar19;
  undefined8 uVar20;
  size_t sVar21;
  NAMED **ppNVar22;
  NAMED **ppNVar23;
  XML_Parser pvVar24;
  int iVar25;
  XML_Char local_102 [2];
  undefined4 local_100;
  undefined4 uStack_fc;
  XML_Char tmp [2];
  int oldns_triplets;
  XML_ParamEntityParsing oldParamEntityParsing;
  void *oldExternalEntityRefHandlerArg;
  int oldDefaultExpandInternalEntities;
  void *oldHandlerArg;
  void *oldUserData;
  ELEMENT_TYPE *oldDeclElementType;
  XML_XmlDeclHandler oldXmlDeclHandler;
  XML_EntityDeclHandler oldEntityDeclHandler;
  XML_AttlistDeclHandler oldAttlistDeclHandler;
  XML_ElementDeclHandler oldElementDeclHandler;
  XML_UnknownEncodingHandler oldUnknownEncodingHandler;
  XML_ExternalEntityRefHandler oldExternalEntityRefHandler;
  XML_NotStandaloneHandler oldNotStandaloneHandler;
  XML_EndNamespaceDeclHandler oldEndNamespaceDeclHandler;
  XML_StartNamespaceDeclHandler oldStartNamespaceDeclHandler;
  XML_NotationDeclHandler oldNotationDeclHandler;
  XML_UnparsedEntityDeclHandler oldUnparsedEntityDeclHandler;
  XML_DefaultHandler oldDefaultHandler;
  XML_EndCdataSectionHandler oldEndCdataSectionHandler;
  XML_StartCdataSectionHandler oldStartCdataSectionHandler;
  XML_CommentHandler oldCommentHandler;
  XML_ProcessingInstructionHandler oldProcessingInstructionHandler;
  XML_CharacterDataHandler oldCharacterDataHandler;
  XML_EndElementHandler oldEndElementHandler;
  XML_StartElementHandler oldStartElementHandler;
  DTD *oldDtd;
  XML_Parser parser;
  XML_Char *encodingName_local;
  XML_Char *context_local;
  XML_Parser oldParser_local;
  
  sVar2 = *(size_t *)((long)oldParser + 0x68);
  pXVar3 = *(XML_Memory_Handling_Suite **)((long)oldParser + 0x70);
  ppNVar4 = *(NAMED ***)((long)oldParser + 0x78);
  sVar5 = *(size_t *)((long)oldParser + 0x80);
  sVar6 = *(size_t *)((long)oldParser + 0x88);
  sVar7 = *(size_t *)((long)oldParser + 0x90);
  pXVar8 = *(XML_Memory_Handling_Suite **)((long)oldParser + 0x98);
  pBVar9 = *(BLOCK **)((long)oldParser + 0xa0);
  pXVar10 = *(XML_Char **)((long)oldParser + 0xb8);
  pXVar11 = *(XML_Char **)((long)oldParser + 0xc0);
  pXVar12 = *(XML_Memory_Handling_Suite **)((long)oldParser + 200);
  uVar13 = *(undefined8 *)((long)oldParser + 0xd0);
  ppNVar14 = *(NAMED ***)((long)oldParser + 0xd8);
  sVar15 = *(size_t *)((long)oldParser + 0xe0);
  sVar16 = *(size_t *)((long)oldParser + 0xf0);
  pXVar17 = *(XML_Memory_Handling_Suite **)((long)oldParser + 0xf8);
  pXVar18 = *(XML_Char **)((long)oldParser + 0x100);
  pBVar19 = *(BINDING **)((long)oldParser + 0x108);
  uVar20 = *(undefined8 *)((long)oldParser + 0x110);
  sVar21 = *(size_t *)((long)oldParser + 0x278);
  ppNVar22 = *oldParser;
  ppNVar23 = *(NAMED ***)((long)oldParser + 8);
  uVar1 = *(undefined4 *)((long)oldParser + 0x238);
  pvVar24 = *(XML_Parser *)((long)oldParser + 0xe8);
  uStack_fc = *(undefined4 *)((long)oldParser + 0x48c);
  local_100 = *(undefined4 *)((long)oldParser + 0x1cc);
  if (*(int *)((long)oldParser + 0x1c8) == 0) {
    oldDtd = (DTD *)cm_expat_XML_ParserCreate_MM
                              (encodingName,(XML_Memory_Handling_Suite *)((long)oldParser + 0x18),
                               (XML_Char *)0x0);
  }
  else {
    local_102[0] = *(XML_Char *)((long)oldParser + 0x488);
    oldDtd = (DTD *)cm_expat_XML_ParserCreate_MM
                              (encodingName,(XML_Memory_Handling_Suite *)((long)oldParser + 0x18),
                               local_102);
  }
  if (oldDtd != (DTD *)0x0) {
    (oldDtd->attributeIds).usedLim = sVar2;
    (oldDtd->attributeIds).mem = pXVar3;
    (oldDtd->prefixes).v = ppNVar4;
    (oldDtd->prefixes).size = sVar5;
    (oldDtd->prefixes).used = sVar6;
    (oldDtd->prefixes).usedLim = sVar7;
    (oldDtd->prefixes).mem = pXVar8;
    (oldDtd->pool).blocks = pBVar9;
    (oldDtd->pool).ptr = pXVar10;
    (oldDtd->pool).start = pXVar11;
    (oldDtd->pool).mem = pXVar12;
    oldDtd->complete = (int)uVar13;
    oldDtd->standalone = (int)((ulong)uVar13 >> 0x20);
    (oldDtd->paramEntities).v = ppNVar14;
    (oldDtd->paramEntities).size = sVar15;
    (oldDtd->paramEntities).usedLim = sVar16;
    (oldDtd->paramEntities).mem = pXVar17;
    (oldDtd->defaultPrefix).name = pXVar18;
    (oldDtd->defaultPrefix).binding = pBVar19;
    *(undefined8 *)&oldDtd->in_eldecl = uVar20;
    oldDtd[2].generalEntities.size = sVar21;
    (oldDtd->generalEntities).v = ppNVar22;
    if (ppNVar22 == ppNVar23) {
      (oldDtd->generalEntities).size = (size_t)(oldDtd->generalEntities).v;
    }
    else {
      (oldDtd->generalEntities).size = (size_t)oldDtd;
    }
    if (pvVar24 != oldParser) {
      (oldDtd->paramEntities).used = (size_t)pvVar24;
    }
    *(undefined4 *)&oldDtd[1].defaultPrefix.name = uVar1;
    *(undefined4 *)((long)&oldDtd[1].prefixes.usedLim + 4) = local_100;
    *(undefined4 *)((long)&oldDtd[3].paramEntities.size + 4) = uStack_fc;
    if (context == (XML_Char *)0x0) {
      dtdSwap((DTD *)&oldDtd[2].generalEntities.mem,(DTD *)((long)oldParser + 0x290));
      oldDtd[3].paramEntities.used = (size_t)oldParser;
      cm_expat_XmlPrologStateInitExternalEntity((PROLOG_STATE *)&oldDtd[1].pool.ptr);
      *(undefined4 *)&oldDtd[2].paramEntities.usedLim = 1;
      *(undefined4 *)((long)&oldDtd[3].paramEntities.v + 4) = 1;
    }
    else {
      iVar25 = dtdCopy((DTD *)&oldDtd[2].generalEntities.mem,(DTD *)((long)oldParser + 0x290),oldDtd
                      );
      if ((iVar25 == 0) || (iVar25 = setContext(oldDtd,context), iVar25 == 0)) {
        cm_expat_XML_ParserFree(oldDtd);
        return (XML_Parser)0x0;
      }
      *(code **)&oldDtd[1].complete = externalEntityInitProcessor;
    }
    return oldDtd;
  }
  return (XML_Parser)0x0;
}

Assistant:

XML_Parser XML_ExternalEntityParserCreate(XML_Parser oldParser,
                                          const XML_Char *context,
                                          const XML_Char *encodingName)
{
  XML_Parser parser = oldParser;
  DTD *oldDtd = &dtd;
  XML_StartElementHandler oldStartElementHandler = startElementHandler;
  XML_EndElementHandler oldEndElementHandler = endElementHandler;
  XML_CharacterDataHandler oldCharacterDataHandler = characterDataHandler;
  XML_ProcessingInstructionHandler oldProcessingInstructionHandler = processingInstructionHandler;
  XML_CommentHandler oldCommentHandler = commentHandler;
  XML_StartCdataSectionHandler oldStartCdataSectionHandler = startCdataSectionHandler;
  XML_EndCdataSectionHandler oldEndCdataSectionHandler = endCdataSectionHandler;
  XML_DefaultHandler oldDefaultHandler = defaultHandler;
  XML_UnparsedEntityDeclHandler oldUnparsedEntityDeclHandler = unparsedEntityDeclHandler;
  XML_NotationDeclHandler oldNotationDeclHandler = notationDeclHandler;
  XML_StartNamespaceDeclHandler oldStartNamespaceDeclHandler = startNamespaceDeclHandler;
  XML_EndNamespaceDeclHandler oldEndNamespaceDeclHandler = endNamespaceDeclHandler;
  XML_NotStandaloneHandler oldNotStandaloneHandler = notStandaloneHandler;
  XML_ExternalEntityRefHandler oldExternalEntityRefHandler = externalEntityRefHandler;
  XML_UnknownEncodingHandler oldUnknownEncodingHandler = unknownEncodingHandler;
  XML_ElementDeclHandler oldElementDeclHandler = elementDeclHandler;
  XML_AttlistDeclHandler oldAttlistDeclHandler = attlistDeclHandler;
  XML_EntityDeclHandler oldEntityDeclHandler = entityDeclHandler;
  XML_XmlDeclHandler oldXmlDeclHandler = xmlDeclHandler;
  ELEMENT_TYPE * oldDeclElementType = declElementType;

  void *oldUserData = userData;
  void *oldHandlerArg = handlerArg;
  int oldDefaultExpandInternalEntities = defaultExpandInternalEntities;
  void *oldExternalEntityRefHandlerArg = externalEntityRefHandlerArg;
#ifdef XML_DTD
  enum XML_ParamEntityParsing oldParamEntityParsing = paramEntityParsing;
#endif
  int oldns_triplets = ns_triplets;

  if (ns) {
    XML_Char tmp[2];

    *tmp = namespaceSeparator;
    parser = XML_ParserCreate_MM(encodingName, &((Parser *)parser)->m_mem,
                                 tmp);
  }
  else {
    parser = XML_ParserCreate_MM(encodingName, &((Parser *)parser)->m_mem,
                                 NULL);
  }

  if (!parser)
    return 0;

  startElementHandler = oldStartElementHandler;
  endElementHandler = oldEndElementHandler;
  characterDataHandler = oldCharacterDataHandler;
  processingInstructionHandler = oldProcessingInstructionHandler;
  commentHandler = oldCommentHandler;
  startCdataSectionHandler = oldStartCdataSectionHandler;
  endCdataSectionHandler = oldEndCdataSectionHandler;
  defaultHandler = oldDefaultHandler;
  unparsedEntityDeclHandler = oldUnparsedEntityDeclHandler;
  notationDeclHandler = oldNotationDeclHandler;
  startNamespaceDeclHandler = oldStartNamespaceDeclHandler;
  endNamespaceDeclHandler = oldEndNamespaceDeclHandler;
  notStandaloneHandler = oldNotStandaloneHandler;
  externalEntityRefHandler = oldExternalEntityRefHandler;
  unknownEncodingHandler = oldUnknownEncodingHandler;
  elementDeclHandler = oldElementDeclHandler;
  attlistDeclHandler = oldAttlistDeclHandler;
  entityDeclHandler = oldEntityDeclHandler;
  xmlDeclHandler = oldXmlDeclHandler;
  declElementType = oldDeclElementType;
  userData = oldUserData;
  if (oldUserData == oldHandlerArg)
    handlerArg = userData;
  else
    handlerArg = parser;
  if (oldExternalEntityRefHandlerArg != oldParser)
    externalEntityRefHandlerArg = oldExternalEntityRefHandlerArg;
  defaultExpandInternalEntities = oldDefaultExpandInternalEntities;
  ns_triplets = oldns_triplets;
#ifdef XML_DTD
  paramEntityParsing = oldParamEntityParsing;
  if (context) {
#endif /* XML_DTD */
    if (!dtdCopy(&dtd, oldDtd, parser) || !setContext(parser, context)) {
      XML_ParserFree(parser);
      return 0;
    }
    processor = externalEntityInitProcessor;
#ifdef XML_DTD
  }
  else {
    dtdSwap(&dtd, oldDtd);
    parentParser = oldParser;
    XmlPrologStateInitExternalEntity(&prologState);
    dtd.complete = 1;
    hadExternalDoctype = 1;
  }
#endif /* XML_DTD */
  return parser;
}